

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.c
# Opt level: O0

int ThreadPoolSetAttr(ThreadPool *tp,ThreadPoolAttr *attr)

{
  int iVar1;
  int local_54;
  undefined1 local_50 [4];
  int i;
  ThreadPoolAttr temp;
  int retCode;
  ThreadPoolAttr *attr_local;
  ThreadPool *tp_local;
  
  temp._36_4_ = 0;
  if (tp == (ThreadPool *)0x0) {
    tp_local._4_4_ = 0x16;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)tp);
    if (attr == (ThreadPoolAttr *)0x0) {
      TPAttrInit((ThreadPoolAttr *)local_50);
    }
    else {
      memcpy(local_50,attr,0x28);
    }
    iVar1 = SetPolicyType(temp.maxJobsTotal);
    if (iVar1 == 0) {
      memcpy(&tp->attr,local_50,0x28);
      if (tp->totalThreads < (tp->attr).minThreads) {
        local_54 = tp->totalThreads;
        while ((local_54 < (tp->attr).minThreads &&
               (temp._36_4_ = CreateWorker(tp), temp._36_4_ == 0))) {
          local_54 = local_54 + 1;
        }
      }
      pthread_cond_signal((pthread_cond_t *)&tp->condition);
      pthread_mutex_unlock((pthread_mutex_t *)tp);
      if (temp._36_4_ != 0) {
        ThreadPoolShutdown(tp);
      }
      tp_local._4_4_ = temp._36_4_;
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)tp);
      tp_local._4_4_ = 0x20000000;
    }
  }
  return tp_local._4_4_;
}

Assistant:

int ThreadPoolSetAttr(ThreadPool *tp, ThreadPoolAttr *attr)
{
	int retCode = 0;
	ThreadPoolAttr temp;
	int i = 0;

	if (!tp)
		return EINVAL;

	ithread_mutex_lock(&tp->mutex);

	if (attr)
		temp = *attr;
	else
		TPAttrInit(&temp);
	if (SetPolicyType(temp.schedPolicy) != 0) {
		ithread_mutex_unlock(&tp->mutex);
		return INVALID_POLICY;
	}
	tp->attr = temp;
	/* add threads */
	if (tp->totalThreads < tp->attr.minThreads) {
		for (i = tp->totalThreads; i < tp->attr.minThreads; i++) {
			retCode = CreateWorker(tp);
			if (retCode != 0) {
				break;
			}
		}
	}
	/* signal changes */
	ithread_cond_signal(&tp->condition);

	ithread_mutex_unlock(&tp->mutex);

	if (retCode != 0)
		/* clean up if the min threads could not be created */
		ThreadPoolShutdown(tp);

	return retCode;
}